

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O1

void __thiscall
TasGrid::TasmanianSparseGrid::getNeededPoints
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x)

{
  BaseCanonicalGrid *pBVar1;
  long lVar2;
  long lVar3;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    lVar2 = 0;
    lVar3 = 0;
  }
  else {
    lVar2 = (long)*(int *)(pBVar1 + 0x10);
    lVar3 = (long)*(int *)(pBVar1 + 0x48);
  }
  std::vector<double,_std::allocator<double>_>::resize(x,lVar3 * lVar2);
  TasGrid::TasmanianSparseGrid::getNeededPoints((double *)this);
  return;
}

Assistant:

void getNeededPoints(std::vector<double> &x) const{ x.resize(Utils::size_mult(getNumDimensions(), getNumNeeded())); getNeededPoints(x.data()); }